

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool __thiscall lunasvg::decodeText(lunasvg *this,string_view input,string *output)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  const_reference pvVar4;
  char cVar5;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  byte local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  undefined1 local_35;
  uint uStack_34;
  char c [5];
  uint cp;
  int base;
  value_type ch;
  string *output_local;
  string_view input_local;
  
  input_local._M_len = input._M_len;
  output_local = (string *)this;
  std::__cxx11::string::clear();
  do {
    while( true ) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&output_local);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        return true;
      }
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)&output_local);
      cVar1 = *pvVar4;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&output_local,1);
      cVar5 = (char)input._M_str;
      if (cVar1 == '&') break;
      std::__cxx11::string::push_back(cVar5);
    }
    bVar2 = skipDelimiter((string_view *)&output_local,'#');
    if (bVar2) {
      c[1] = '\n';
      c[2] = '\0';
      c[3] = '\0';
      c[4] = '\0';
      bVar2 = skipDelimiter((string_view *)&output_local,'x');
      if (bVar2) {
        c[1] = '\x10';
        c[2] = '\0';
        c[3] = '\0';
        c[4] = '\0';
      }
      bVar2 = parseInteger<unsigned_int>
                        ((string_view *)&output_local,&stack0xffffffffffffffcc,c._1_4_);
      if (!bVar2) {
        return false;
      }
      memset(&local_39,0,5);
      bVar3 = (byte)uStack_34;
      if (uStack_34 < 0x80) {
        local_38 = 0;
        local_39 = bVar3;
      }
      else if (uStack_34 < 0x800) {
        local_37 = 0;
        local_38 = bVar3 & 0x3f | 0x80;
        uStack_34 = uStack_34 >> 6;
        local_39 = (byte)uStack_34 | 0xc0;
      }
      else if (uStack_34 < 0x10000) {
        local_36 = 0;
        local_37 = bVar3 & 0x3f | 0x80;
        local_38 = (byte)(uStack_34 >> 6) & 0x3f | 0x80;
        uStack_34 = uStack_34 >> 0xc;
        local_39 = (byte)uStack_34 | 0xe0;
      }
      else if (uStack_34 < 0x200000) {
        local_35 = 0;
        local_36 = bVar3 & 0x3f | 0x80;
        local_37 = (byte)(uStack_34 >> 6) & 0x3f | 0x80;
        local_38 = (byte)(uStack_34 >> 0xc) & 0x3f | 0x80;
        uStack_34 = uStack_34 >> 0x12;
        local_39 = (byte)uStack_34 | 0xf0;
      }
      std::__cxx11::string::append(input._M_str);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"amp");
      bVar2 = skipString((string_view *)&output_local,&local_50);
      if (bVar2) {
        std::__cxx11::string::push_back(cVar5);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"lt");
        bVar2 = skipString((string_view *)&output_local,&local_60);
        if (bVar2) {
          std::__cxx11::string::push_back(cVar5);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"gt");
          bVar2 = skipString((string_view *)&output_local,&local_70);
          if (bVar2) {
            std::__cxx11::string::push_back(cVar5);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_80,"quot");
            bVar2 = skipString((string_view *)&output_local,&local_80);
            if (bVar2) {
              std::__cxx11::string::push_back(cVar5);
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_90,"apos");
              bVar2 = skipString((string_view *)&output_local,&local_90);
              if (!bVar2) {
                return false;
              }
              std::__cxx11::string::push_back(cVar5);
            }
          }
        }
      }
    }
    bVar2 = skipDelimiter((string_view *)&output_local,';');
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

inline bool decodeText(std::string_view input, std::string& output)
{
    output.clear();
    while(!input.empty()) {
        auto ch = input.front();
        input.remove_prefix(1);
        if(ch != '&') {
            output.push_back(ch);
            continue;
        }

        if(skipDelimiter(input, '#')) {
            int base = 10;
            if(skipDelimiter(input, 'x'))
                base = 16;
            unsigned int cp;
            if(!parseInteger(input, cp, base))
                return false;
            char c[5] = {0, 0, 0, 0, 0};
            if(cp < 0x80) {
                c[1] = 0;
                c[0] = char(cp);
            } else if(cp < 0x800) {
                c[2] = 0;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xC0);
            } else if(cp < 0x10000) {
                c[3] = 0;
                c[2] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xE0);
            } else if(cp < 0x200000) {
                c[4] = 0;
                c[3] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[2] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xF0);
            }

            output.append(c);
        } else {
            if(skipString(input, "amp")) {
                output.push_back('&');
            } else if(skipString(input, "lt")) {
                output.push_back('<');
            } else if(skipString(input, "gt")) {
                output.push_back('>');
            } else if(skipString(input, "quot")) {
                output.push_back('\"');
            } else if(skipString(input, "apos")) {
                output.push_back('\'');
            } else {
                return false;
            }
        }

        if(!skipDelimiter(input, ';')) {
            return false;
        }
    }

    return true;
}